

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::MultiPartInputFile::initialize(MultiPartInputFile *this)

{
  bool bVar1;
  InputExc *pIVar2;
  size_type sVar3;
  ArgExc *pAVar4;
  reference __lhs;
  size_type sVar5;
  InputPartData *pIVar6;
  vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_> *this_00;
  Header *pHVar7;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  int *in_stack_00000070;
  IStream *in_stack_00000078;
  GenericInputFile *in_stack_00000080;
  size_t i_3;
  size_t j;
  string attrNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attrs;
  size_t i_2;
  size_t i_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  size_t i;
  Header header;
  int pos;
  bool tiled;
  bool multipart;
  int *in_stack_00000320;
  IStream *in_stack_00000328;
  Header *in_stack_00000330;
  undefined1 in_stack_000017de;
  undefined1 in_stack_000017df;
  Header *in_stack_000017e0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd08;
  string *in_stack_fffffffffffffd10;
  value_type *in_stack_fffffffffffffd18;
  Header *in_stack_fffffffffffffd20;
  Header *header_00;
  value_type *in_stack_fffffffffffffd28;
  InputStreamMutex *mutex;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd30;
  InputPartData *this_01;
  undefined8 in_stack_fffffffffffffd38;
  Data *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  V2f *in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  Header *in_stack_fffffffffffffd70;
  ulong uVar9;
  InputPartData *local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe68;
  Header *in_stack_fffffffffffffe70;
  Header *in_stack_fffffffffffffe78;
  Data *in_stack_fffffffffffffe80;
  string local_170 [8];
  string *in_stack_fffffffffffffe98;
  Header *in_stack_fffffffffffffea0;
  size_type local_150;
  string local_148 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  ulong local_110;
  _Base_ptr local_108;
  undefined1 local_100;
  undefined1 local_f1;
  string local_d0 [32];
  _Self local_b0;
  _Self local_a8;
  ulong local_a0;
  ulong local_68;
  int local_60;
  Vec2<float> local_50;
  Header local_48;
  int local_10;
  undefined1 local_a;
  byte local_9;
  
  GenericInputFile::readMagicNumberAndVersionField
            (in_stack_00000080,in_stack_00000078,in_stack_00000070);
  local_9 = isMultiPart(*(int *)(*(long *)(in_RDI + 8) + 0x38));
  local_a = isTiled(*(int *)(*(long *)(in_RDI + 8) + 0x38));
  if (((bool)local_a) && ((local_9 & 1) != 0)) {
    pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar2,"Multipart files cannot have the tiled bit set");
    __cxa_throw(pIVar2,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  local_10 = 0;
  do {
    Imath_2_5::Vec2<float>::Vec2(&local_50,0.0,0.0);
    Header::Header(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68,
                   (float)((ulong)in_stack_fffffffffffffd60 >> 0x20),in_stack_fffffffffffffd58,
                   (float)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                   (LineOrder)in_stack_fffffffffffffd50,
                   (Compression)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    Header::readFrom(in_stack_00000330,in_stack_00000328,in_stack_00000320);
    bVar1 = Header::readsNothing(&local_48);
    if (bVar1) {
      local_10 = local_10 + 1;
      local_60 = 3;
    }
    else {
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                 in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      if ((local_9 & 1) == 0) {
        local_60 = 3;
      }
      else {
        local_60 = 0;
      }
    }
    Header::~Header(in_stack_fffffffffffffd20);
  } while (local_60 == 0);
  local_68 = 0;
  while( true ) {
    uVar9 = local_68;
    sVar3 = std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::size
                      ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                       (*(long *)(in_RDI + 8) + 0x90));
    if (sVar3 <= uVar9) {
      if ((local_9 & 1) != 0) {
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x1bb05f);
        for (local_a0 = 0; uVar9 = local_a0,
            sVar3 = std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::size
                              ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                               (*(long *)(in_RDI + 8) + 0x90)), uVar9 < sVar3;
            local_a0 = local_a0 + 1) {
          std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
                    ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                     (*(long *)(in_RDI + 8) + 0x90),local_a0);
          Header::name_abi_cxx11_((Header *)0x1bb0cf);
          local_a8._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
          local_b0._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(in_stack_fffffffffffffd08);
          bVar1 = std::operator!=(&local_a8,&local_b0);
          if (bVar1) {
            local_f1 = 1;
            pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
            std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
                      ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                       (*(long *)(in_RDI + 8) + 0x90),local_a0);
            Header::name_abi_cxx11_((Header *)0x1bb180);
            std::operator+((char *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
            Iex_2_5::InputExc::InputExc(pIVar2,local_d0);
            local_f1 = 0;
            __cxa_throw(pIVar2,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
          }
          std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
                    ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                     (*(long *)(in_RDI + 8) + 0x90),local_a0);
          Header::name_abi_cxx11_((Header *)0x1bb2bc);
          pVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
          local_108 = (_Base_ptr)pVar8.first._M_node;
          local_100 = pVar8.second;
        }
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1bb324);
      }
      if ((local_9 & 1) != 0) {
        local_110 = 1;
        while (uVar9 = local_110,
              sVar3 = std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::size
                                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                                 (*(long *)(in_RDI + 8) + 0x90)), uVar9 < sVar3) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x1bb39a);
          __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   (in_RDI + 8);
          __lhs = std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
                            ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                             &__rhs[4].field_2,0);
          std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
                    ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                     (*(long *)(in_RDI + 8) + 0x90),local_110);
          bVar1 = Data::checkSharedAttributesValues
                            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                             in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          if (bVar1) {
            std::__cxx11::string::string(local_148);
            local_150 = 0;
            while (sVar3 = local_150,
                  sVar5 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size(&local_128), sVar3 < sVar5) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_128,local_150);
              std::operator+((char *)__lhs,__rhs);
              std::__cxx11::string::operator+=(local_148,local_170);
              std::__cxx11::string::~string(local_170);
              local_150 = local_150 + 1;
            }
            pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
            std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
                      ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                       (*(long *)(in_RDI + 8) + 0x90),local_110);
            Header::name_abi_cxx11_((Header *)0x1bb556);
            std::operator+((char *)__lhs,__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
            Iex_2_5::InputExc::InputExc(pIVar2,(string *)&stack0xfffffffffffffe70);
            __cxa_throw(pIVar2,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffd20);
          local_110 = local_110 + 1;
        }
      }
      local_1e0 = (InputPartData *)0x0;
      while (this_01 = local_1e0,
            pIVar6 = (InputPartData *)
                     std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::size
                               ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                                (*(long *)(in_RDI + 8) + 0x90)), this_01 < pIVar6) {
        this_00 = (vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_> *)
                  (*(long *)(in_RDI + 8) + 0x40);
        pHVar7 = (Header *)operator_new(0x70);
        mutex = *(InputStreamMutex **)(in_RDI + 8);
        header_00 = pHVar7;
        std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
                  ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                   &mutex[2].super_Mutex.super___mutex_base._M_mutex.__data.__list.__next,
                   (size_type)local_1e0);
        InputPartData::InputPartData
                  (this_01,mutex,header_00,(int)((ulong)pHVar7 >> 0x20),(int)pHVar7,
                   (int)((ulong)this_00 >> 0x20));
        std::vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>::push_back
                  (this_00,(value_type *)in_stack_fffffffffffffd08);
        local_1e0 = (InputPartData *)&(local_1e0->header)._map._M_t._M_impl.field_0x1;
      }
      Data::readChunkOffsetTables
                (in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0));
      return;
    }
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
              ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
               (*(long *)(in_RDI + 8) + 0x90),local_68);
    bVar1 = Header::hasType((Header *)0x1badb5);
    if (bVar1) {
      if (((local_9 & 1) == 0) &&
         (bVar1 = isNonImage(*(int *)(*(long *)(in_RDI + 8) + 0x38)), !bVar1)) {
        std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
                  ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                   (*(long *)(in_RDI + 8) + 0x90),local_68);
        Header::setType(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      }
    }
    else {
      if ((local_9 & 1) != 0) {
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar4,"Every header in a multipart file should have a type");
        __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                 (*(long *)(in_RDI + 8) + 0x90),local_68);
      Header::setType(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    }
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
              ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
               (*(long *)(in_RDI + 8) + 0x90),local_68);
    bVar1 = Header::hasName((Header *)0x1baf30);
    if ((!bVar1) && ((local_9 & 1) != 0)) break;
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
              ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
               (*(long *)(in_RDI + 8) + 0x90),local_68);
    Header::type_abi_cxx11_((Header *)0x1bafaa);
    bVar1 = isTiled(in_stack_fffffffffffffd10);
    if (bVar1) {
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                 (*(long *)(in_RDI + 8) + 0x90),local_68);
      Header::sanityCheck(in_stack_000017e0,(bool)in_stack_000017df,(bool)in_stack_000017de);
    }
    else {
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                 (*(long *)(in_RDI + 8) + 0x90),local_68);
      Header::sanityCheck(in_stack_000017e0,(bool)in_stack_000017df,(bool)in_stack_000017de);
    }
    local_68 = local_68 + 1;
  }
  pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar4,"Every header in a multipart file should have a name");
  __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
MultiPartInputFile::initialize()
{
    readMagicNumberAndVersionField(*_data->is, _data->version);
    
    bool multipart = isMultiPart(_data->version);
    bool tiled = isTiled(_data->version);

    //
    // Multipart files don't have and shouldn't have the tiled bit set.
    //

    if (tiled && multipart)
        throw IEX_NAMESPACE::InputExc ("Multipart files cannot have the tiled bit set");

    
    int pos = 0;
    while (true)
    {
        Header header;
        header.readFrom(*_data->is, _data->version);

        //
        // If we read nothing then we stop reading.
        //

        if (header.readsNothing())
        {
            pos++;
            break;
        }

        _data->_headers.push_back(header);
        
        if(multipart == false)
          break;
    }

    //
    // Perform usual check on headers.
    //

    for (size_t i = 0; i < _data->_headers.size(); i++)
    {
        //
        // Silently invent a type if the file is a single part regular image.
        //

        if( _data->_headers[i].hasType() == false )
        {
            if(multipart)

                throw IEX_NAMESPACE::ArgExc ("Every header in a multipart file should have a type");
          
            _data->_headers[i].setType(tiled ? TILEDIMAGE : SCANLINEIMAGE);
        }
        else
        {
            
            //
            // Silently fix the header type if it's wrong
            // (happens when a regular Image file written by EXR_2.0 is rewritten by an older library,
            //  so doesn't effect deep image types)
            //

            if(!multipart && !isNonImage(_data->version))
            {
                _data->_headers[i].setType(tiled ? TILEDIMAGE : SCANLINEIMAGE);
            }
        }
         

        
        if( _data->_headers[i].hasName() == false )
        {
            if(multipart)
                throw IEX_NAMESPACE::ArgExc ("Every header in a multipart file should have a name");
        }
        
        if (isTiled(_data->_headers[i].type()))
            _data->_headers[i].sanityCheck(true, multipart);
        else
            _data->_headers[i].sanityCheck(false, multipart);
    }

    //
    // Check name uniqueness.
    //

    if (multipart)
    {
        set<string> names;
        for (size_t i = 0; i < _data->_headers.size(); i++)
        {
        
            if (names.find(_data->_headers[i].name()) != names.end())
            {
                throw IEX_NAMESPACE::InputExc ("Header name " + _data->_headers[i].name() +
                                   " is not a unique name.");
            }
            names.insert(_data->_headers[i].name());
        }
    }
    
    //
    // Check shared attributes compliance.
    //

    if (multipart && strictSharedAttribute)
    {
        for (size_t i = 1; i < _data->_headers.size(); i++)
        {
            vector <string> attrs;
            if (_data->checkSharedAttributesValues (_data->_headers[0], _data->_headers[i], attrs))
            {
                string attrNames;
                for (size_t j=0; j<attrs.size(); j++)
                    attrNames += " " + attrs[j];
                throw IEX_NAMESPACE::InputExc ("Header name " + _data->_headers[i].name() +
                                     " has non-conforming shared attributes: "+
                                     attrNames);
            }
        }
    }

    //
    // Create InputParts and read chunk offset tables.
    //
        
    for (size_t i = 0; i < _data->_headers.size(); i++)
        _data->parts.push_back(
                new InputPartData(_data, _data->_headers[i], i, _data->numThreads, _data->version));

    _data->readChunkOffsetTables(_data->reconstructChunkOffsetTable);
}